

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

Var __thiscall Clasp::Solver::pushAuxVar(Solver *this)

{
  Var v;
  long *plVar1;
  left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> local_38;
  
  v = Assignment::addVar(&this->assign_);
  setPref(this,v,def_value,'\x02');
  local_38.buf_ = (buf_type *)0x0;
  local_38._8_4_ = 0;
  local_38.left_ = 0;
  local_38.right_ = 0;
  bk_lib::
  pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
  ::insert(&this->watches_,(this->watches_).ebo_.buf + (this->watches_).ebo_.size,2,
           (left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U> *)&local_38);
  bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::release(&local_38);
  plVar1 = (long *)((this->heuristic_).ptr_ & 0xfffffffffffffffe);
  (**(code **)(*plVar1 + 0x30))(plVar1,this,v,1);
  return v;
}

Assistant:

Var Solver::pushAuxVar() {
	assert(!lazyRem_);
	Var aux = assign_.addVar();
	setPref(aux, ValueSet::def_value, value_false);
	watches_.insert(watches_.end(), 2, WatchList());
	heuristic_->updateVar(*this, aux, 1);
	return aux;
}